

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O0

void __thiscall
MODEL3D::three_dim_model::generate_freecad_fill
          (three_dim_model *this,Path *outline,Paths *primary,Paths *secondary,int *layer_number)

{
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  string local_640;
  string local_620;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  string local_5a0;
  string local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_520;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_500;
  string local_4e0;
  string local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  string local_440;
  string local_420;
  string local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  string local_320;
  string local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *local_260;
  bool local_252;
  bool local_251;
  __normal_iterator<const_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
  local_250;
  const_iterator secondary_it;
  const_iterator secondary_end;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *local_c0;
  bool local_b2;
  bool local_b1;
  __normal_iterator<const_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
  local_b0;
  const_iterator primary_it;
  const_iterator primary_end;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int *local_30;
  int *layer_number_local;
  Paths *secondary_local;
  Paths *primary_local;
  Path *outline_local;
  three_dim_model *this_local;
  
  local_30 = layer_number;
  layer_number_local = (int *)secondary;
  secondary_local = primary;
  primary_local = (Paths *)outline;
  outline_local = (Path *)this;
  std::__cxx11::to_string(&local_90,*layer_number);
  std::operator+(&local_70,"    subtractive_ingredients_",&local_90);
  std::operator+(&local_50,&local_70," = []");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  primary_it = std::
               vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
               ::end(secondary_local);
  local_b0._M_current =
       (vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
       std::
       vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
       ::begin(secondary_local);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_b0,&primary_it);
    if (!bVar1) break;
    pvVar3 = __gnu_cxx::
             __normal_iterator<const_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
             ::operator*(&local_b0);
    local_b1 = true;
    local_b2 = false;
    push_freecad_pss(this,pvVar3,&local_b1,local_30,&local_b2,&this->subtractive_overlap_factor);
    local_c0 = (vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
               __gnu_cxx::
               __normal_iterator<const_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
               ::operator++(&local_b0,0);
  }
  build_subtractive_shapes(this,local_30);
  std::__cxx11::to_string(&local_1a0,*local_30);
  std::operator+(&local_180,"    subtractive_cut_",&local_1a0);
  std::operator+(&local_160,&local_180,"= additive_block_");
  std::__cxx11::to_string(&local_1c0,*local_30);
  std::operator+(&local_140,&local_160,&local_1c0);
  std::operator+(&local_120,&local_140,".cut(subtractives_");
  std::__cxx11::to_string(&local_1e0,*local_30);
  std::operator+(&local_100,&local_120,&local_1e0);
  std::operator+(&local_e0,&local_100,")");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_1a0);
  sVar2 = std::
          vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
          ::size((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                  *)layer_number_local);
  if (sVar2 == 0) {
    std::__cxx11::to_string(&local_4c0,*local_30);
    std::operator+(&local_4a0,"    layer_",&local_4c0);
    std::operator+(&local_480,&local_4a0,"=subtractive_cut_");
    std::__cxx11::to_string(&local_4e0,*local_30);
    std::operator+(&local_460,&local_480,&local_4e0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->py_script,&local_460);
    std::__cxx11::string::~string((string *)&local_460);
    std::__cxx11::string::~string((string *)&local_4e0);
    std::__cxx11::string::~string((string *)&local_480);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::__cxx11::string::~string((string *)&local_4c0);
  }
  else {
    std::__cxx11::to_string((string *)&secondary_end,*local_30);
    std::operator+(&local_220,"    additive_ingredients_",(string *)&secondary_end);
    std::operator+(&local_200,&local_220," = []");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->py_script,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_220);
    std::__cxx11::string::~string((string *)&secondary_end);
    secondary_it = std::
                   vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                   ::end((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                          *)layer_number_local);
    local_250._M_current =
         (vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
         std::
         vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
         ::begin((vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                  *)layer_number_local);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=(&local_250,&secondary_it);
      if (!bVar1) break;
      pvVar3 = __gnu_cxx::
               __normal_iterator<const_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
               ::operator*(&local_250);
      local_251 = false;
      local_252 = true;
      push_freecad_pss(this,pvVar3,&local_251,local_30,&local_252,&this->island_overlap_factor);
      local_260 = (vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_> *)
                  __gnu_cxx::
                  __normal_iterator<const_std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_*,_std::vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>_>
                  ::operator++(&local_250,0);
    }
    std::__cxx11::to_string(&local_300,*local_30);
    std::operator+(&local_2e0,"    additives_",&local_300);
    std::operator+(&local_2c0,&local_2e0," = list(pool.map(create_pss, additive_ingredients_");
    std::__cxx11::to_string(&local_320,*local_30);
    std::operator+(&local_2a0,&local_2c0,&local_320);
    std::operator+(&local_280,&local_2a0,"))");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->py_script,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::to_string(&local_400,*local_30);
    std::operator+(&local_3e0,"    layer_",&local_400);
    std::operator+(&local_3c0,&local_3e0,"=subtractive_cut_");
    std::__cxx11::to_string(&local_420,*local_30);
    std::operator+(&local_3a0,&local_3c0,&local_420);
    std::operator+(&local_380,&local_3a0,".fuse(additives_");
    std::__cxx11::to_string(&local_440,*local_30);
    std::operator+(&local_360,&local_380,&local_440);
    std::operator+(&local_340,&local_360,")");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->py_script,&local_340);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_440);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_420);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_400);
  }
  std::__cxx11::to_string(&local_580,*local_30);
  std::operator+(&local_560,"    lyr_",&local_580);
  std::operator+(&local_540,&local_560," = My_doc.addObject(\"Part::Feature\",\"layer_");
  std::__cxx11::to_string(&local_5a0,*local_30);
  std::operator+(&local_520,&local_540,&local_5a0);
  std::operator+(&local_500,&local_520,"\")");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_500);
  std::__cxx11::string::~string((string *)&local_500);
  std::__cxx11::string::~string((string *)&local_520);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::__cxx11::string::~string((string *)&local_540);
  std::__cxx11::string::~string((string *)&local_560);
  std::__cxx11::string::~string((string *)&local_580);
  std::__cxx11::to_string(&local_620,*local_30);
  std::operator+(&local_600,"    lyr_",&local_620);
  std::operator+(&local_5e0,&local_600,".Shape = layer_");
  std::__cxx11::to_string(&local_640,*local_30);
  std::operator+(&local_5c0,&local_5e0,&local_640);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->py_script,&local_5c0);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::__cxx11::string::~string((string *)&local_640);
  std::__cxx11::string::~string((string *)&local_5e0);
  std::__cxx11::string::~string((string *)&local_600);
  std::__cxx11::string::~string((string *)&local_620);
  return;
}

Assistant:

void MODEL3D::three_dim_model::generate_freecad_fill(
const ClipperLib::Path &outline,
const ClipperLib::Paths &primary,
const ClipperLib::Paths &secondary,
const int &layer_number)
{
    // Create the list of subtractive shapes
    py_script.push_back("    subtractive_ingredients_"+std::to_string(layer_number)+" = []");
    auto primary_end = primary.end();
    for (auto primary_it = primary.begin();
         primary_it != primary_end;
         primary_it++)
    {
        push_freecad_pss(*primary_it, true, layer_number, false, subtractive_overlap_factor);
    }
    // Build them in python as a list
    build_subtractive_shapes(layer_number);
    // Execute the boolean cut.
    py_script.push_back("    subtractive_cut_"
    +std::to_string(layer_number)
    +"= additive_block_"
    +std::to_string(layer_number)
    +".cut(subtractives_"
    +std::to_string(layer_number)+")");
    // if additive shapes exist
    // Create the list of additive shapes
    if(secondary.size()>0)
    {
        py_script.push_back("    additive_ingredients_"+std::to_string(layer_number)+" = []");
        auto secondary_end = secondary.end();
        for (auto secondary_it = secondary.begin();
            secondary_it != secondary_end;
            secondary_it++)
        {
            push_freecad_pss(*secondary_it, false, layer_number, true, island_overlap_factor);
        }
        // Generate the additive shapes
        py_script.push_back("    additives_"
        +std::to_string(layer_number)+
        " = list(pool.map(create_pss, additive_ingredients_"
        +std::to_string(layer_number)+"))");
        // Execute the boolean fuse
        py_script.push_back("    layer_"
        +std::to_string(layer_number)
        +"=subtractive_cut_"
        +std::to_string(layer_number)
        +".fuse(additives_"
        +std::to_string(layer_number)+")");
    }
    else
    {
        py_script.push_back("    layer_"
        +std::to_string(layer_number)
        +"=subtractive_cut_"
        +std::to_string(layer_number) );
    }
    // py_script.push_back("    Part.show(layer_"
    // +std::to_string(layer_number)+")");
    py_script.push_back("    lyr_"
    +std::to_string(layer_number)+" = My_doc.addObject(\"Part::Feature\",\"layer_"
    +std::to_string(layer_number)+"\")");
    py_script.push_back("    lyr_"+std::to_string(layer_number)
    +".Shape = layer_"+std::to_string(layer_number));
}